

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O1

Availability __thiscall
TapSatisfier::Sign(TapSatisfier *this,XOnlyPubKey *key,
                  vector<unsigned_char,_std::allocator<unsigned_char>_> *sig)

{
  BaseSignatureCreator *pBVar1;
  SigningProvider *this_00;
  SignatureData *pSVar2;
  uint256 *__v;
  uint256 *puVar3;
  base_blob<256U> *pbVar4;
  bool bVar5;
  int iVar6;
  iterator iVar7;
  iterator iVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  _Base_ptr __x;
  Availability AVar9;
  long in_FS_OFFSET;
  initializer_list<uint256> __l;
  KeyOriginInfo info;
  allocator_type local_fa;
  less<uint256> local_f9;
  KeyOriginInfo local_f8;
  uint256 local_d8;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_b8;
  pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo> local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar1 = (this->super_Satisfier<XOnlyPubKey>).m_creator;
  this_00 = (this->super_Satisfier<XOnlyPubKey>).m_provider;
  pSVar2 = (this->super_Satisfier<XOnlyPubKey>).m_sig_data;
  __v = this->m_leaf_hash;
  local_f8.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = SigningProvider::GetKeyOriginByXOnly(this_00,key,&local_f8);
  if (bVar5) {
    iVar7 = std::
            _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
            ::find(&(pSVar2->taproot_misc_pubkeys)._M_t,key);
    if ((_Rb_tree_header *)iVar7._M_node ==
        &(pSVar2->taproot_misc_pubkeys)._M_t._M_impl.super__Rb_tree_header) {
      local_d8.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(__v->super_base_blob<256U>).m_data._M_elems;
      local_d8.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((__v->super_base_blob<256U>).m_data._M_elems + 8);
      local_d8.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((__v->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_d8.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((__v->super_base_blob<256U>).m_data._M_elems + 0x18);
      __l._M_len = 1;
      __l._M_array = &local_d8;
      std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::set
                ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)&local_b8,__l,
                 &local_f9,&local_fa);
      std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>::
      pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo_&,_true>
                (&local_88,(set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)&local_b8,
                 &local_f8);
      std::
      _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
      ::
      _M_emplace_unique<XOnlyPubKey_const&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                  *)&pSVar2->taproot_misc_pubkeys,key,&local_88);
      if (local_88.second.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.second.path.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.second.path.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.second.path.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                   *)&local_88);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree(&local_b8);
    }
    else {
      std::
      _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>::
      _M_insert_unique<uint256_const&>
                ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                  *)(iVar7._M_node + 2),__v);
    }
  }
  puVar3 = &key->m_keydata;
  local_88.first._M_t._M_impl._0_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[0];
  local_88.first._M_t._M_impl._1_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[1];
  local_88.first._M_t._M_impl._2_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[2];
  local_88.first._M_t._M_impl._3_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[3];
  local_88.first._M_t._M_impl._4_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[4];
  local_88.first._M_t._M_impl._5_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[5];
  local_88.first._M_t._M_impl._6_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[6];
  local_88.first._M_t._M_impl._7_1_ = (puVar3->super_base_blob<256U>).m_data._M_elems[7];
  local_88.first._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((key->m_keydata).super_base_blob<256U>.m_data._M_elems + 8);
  local_88.first._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((key->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x10);
  local_88.first._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)((key->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x18);
  local_88.first._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       *(_Base_ptr *)(__v->super_base_blob<256U>).m_data._M_elems;
  local_88.first._M_t._M_impl.super__Rb_tree_header._M_node_count =
       *(size_t *)((__v->super_base_blob<256U>).m_data._M_elems + 8);
  pbVar4 = &__v->super_base_blob<256U>;
  local_88.second.fingerprint[0] = (pbVar4->m_data)._M_elems[0x10];
  local_88.second.fingerprint[1] = (pbVar4->m_data)._M_elems[0x11];
  local_88.second.fingerprint[2] = (pbVar4->m_data)._M_elems[0x12];
  local_88.second.fingerprint[3] = (pbVar4->m_data)._M_elems[0x13];
  local_88.second._4_1_ = (pbVar4->m_data)._M_elems[0x14];
  local_88.second._5_1_ = (pbVar4->m_data)._M_elems[0x15];
  local_88.second._6_1_ = (pbVar4->m_data)._M_elems[0x16];
  local_88.second._7_1_ = (pbVar4->m_data)._M_elems[0x17];
  local_88.second.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       *(pointer *)((__v->super_base_blob<256U>).m_data._M_elems + 0x18);
  iVar8 = std::
          _Rb_tree<std::pair<XOnlyPubKey,_uint256>,_std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&(pSVar2->taproot_script_sigs)._M_t,(key_type *)&local_88);
  if ((_Rb_tree_header *)iVar8._M_node ==
      &(pSVar2->taproot_script_sigs)._M_t._M_impl.super__Rb_tree_header) {
    AVar9 = NO;
    iVar6 = (*pBVar1->_vptr_BaseSignatureCreator[4])(pBVar1,this_00,sig,key,__v,0,3);
    if ((char)iVar6 == '\0') goto LAB_001a3b2c;
    this_01 = std::
              map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::operator[](&pSVar2->taproot_script_sigs,(key_type *)&local_88);
    __x = (_Base_ptr)sig;
  }
  else {
    __x = iVar8._M_node + 3;
    this_01 = sig;
  }
  AVar9 = YES;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (this_01,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
LAB_001a3b2c:
  if (local_f8.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return AVar9;
  }
  __stack_chk_fail();
}

Assistant:

miniscript::Availability Sign(const XOnlyPubKey& key, std::vector<unsigned char>& sig) const {
        if (CreateTaprootScriptSig(m_creator, m_sig_data, m_provider, sig, key, m_leaf_hash, SigVersion::TAPSCRIPT)) {
            return miniscript::Availability::YES;
        }
        return miniscript::Availability::NO;
    }